

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_structure.h
# Opt level: O3

void __thiscall
xLearn::DMatrix::AddNode
          (DMatrix *this,index_t row_id,index_t feat_id,real_t feat_val,index_t field_id)

{
  pointer ppvVar1;
  iterator __position;
  vector<xLearn::Node,_std::allocator<xLearn::Node>_> *pvVar2;
  ostream *poVar3;
  vector<xLearn::Node,std::allocator<xLearn::Node>> *this_00;
  Node node;
  Logger local_78;
  real_t local_74;
  undefined1 local_70 [16];
  char local_60 [16];
  string local_50;
  
  if (row_id < this->row_length) {
    ppvVar1 = (this->row).
              super__Vector_base<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    this_00 = (vector<xLearn::Node,std::allocator<xLearn::Node>> *)ppvVar1[row_id];
    local_70._8_4_ = feat_val;
    if (this_00 == (vector<xLearn::Node,std::allocator<xLearn::Node>> *)0x0) {
      local_74 = feat_val;
      pvVar2 = (vector<xLearn::Node,_std::allocator<xLearn::Node>_> *)operator_new(0x18);
      *(pointer *)
       ((long)&(pvVar2->super__Vector_base<xLearn::Node,_std::allocator<xLearn::Node>_>)._M_impl.
               super__Vector_impl_data + 0x10) = (pointer)0x0;
      (pvVar2->super__Vector_base<xLearn::Node,_std::allocator<xLearn::Node>_>)._M_impl.
      super__Vector_impl_data._M_start = 0;
      *(pointer *)
       ((long)&(pvVar2->super__Vector_base<xLearn::Node,_std::allocator<xLearn::Node>_>)._M_impl.
               super__Vector_impl_data + 8) = (pointer)0x0;
      ppvVar1[row_id] = pvVar2;
      this_00 = (vector<xLearn::Node,std::allocator<xLearn::Node>> *)
                (this->row).
                super__Vector_base<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
                ._M_impl.super__Vector_impl_data._M_start[row_id];
      local_70._8_4_ = local_74;
    }
    local_70._4_4_ = feat_id;
    local_70._0_4_ = field_id;
    __position._M_current = *(Node **)(this_00 + 8);
    if (__position._M_current == *(Node **)(this_00 + 0x10)) {
      std::vector<xLearn::Node,std::allocator<xLearn::Node>>::_M_realloc_insert<xLearn::Node_const&>
                (this_00,__position,(Node *)local_70);
    }
    else {
      (__position._M_current)->feat_val = (real_t)local_70._8_4_;
      (__position._M_current)->field_id = field_id;
      (__position._M_current)->feat_id = feat_id;
      *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 0xc;
    }
    return;
  }
  local_70._0_8_ = local_60;
  local_78.severity_ = ERR;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_70,
             "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/data/data_structure.h"
             ,"");
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"AddNode","");
  poVar3 = Logger::Start(ERR,(string *)local_70,0xd0,&local_50);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"CHECK_GT failed ",0x10);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,
             "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/data/data_structure.h"
             ,0x5c);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,":",1);
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,0xd0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"row_length",10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," = ",3);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"row_id",6);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," = ",3);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::operator<<(poVar3,"\n");
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)local_70);
  Logger::~Logger(&local_78);
  abort();
}

Assistant:

void AddNode(index_t row_id,  
               index_t feat_id,
               real_t feat_val, 
               index_t field_id = 0) {
    CHECK_GT(row_length, row_id);
    // Allocate memory for the first adding
    if (row[row_id] == nullptr) {
      row[row_id] = new SparseRow;
    }
    Node node(field_id, feat_id, feat_val);
    row[row_id]->push_back(node);
  }